

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O2

IPipelineState * __thiscall
Diligent::ArchiverImpl::GetPipelineState(ArchiverImpl *this,PIPELINE_TYPE PSOType,char *PSOName)

{
  iterator iVar1;
  IPipelineState *pIVar2;
  string msg;
  undefined1 local_48 [32];
  
  std::mutex::lock(&this->m_PipelinesMtx);
  if (PSOType < PIPELINE_TYPE_COUNT) {
    DeviceObjectArchive::NamedResourceKey::NamedResourceKey
              ((NamedResourceKey *)local_48,*(ResourceType *)(&DAT_006ceed8 + (ulong)PSOType * 4),
               PSOName,false);
    iVar1 = std::
            _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_Pipelines)._M_h,(key_type *)local_48);
    HashMapStringKey::Clear((HashMapStringKey *)(local_48 + 8));
    if (iVar1.
        super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pIVar2 = *(IPipelineState **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
                       ._M_cur + 0x20);
      goto LAB_001c4c5f;
    }
  }
  else {
    FormatString<char[25]>((string *)local_48,(char (*) [25])"Unexpected pipeline type");
    DebugAssertionFailed
              ((Char *)local_48._0_8_,"GetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x1a2);
    std::__cxx11::string::~string((string *)local_48);
  }
  pIVar2 = (IPipelineState *)0x0;
LAB_001c4c5f:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_PipelinesMtx);
  return pIVar2;
}

Assistant:

IPipelineState* ArchiverImpl::GetPipelineState(PIPELINE_TYPE PSOType,
                                               const char*   PSOName)
{
    std::lock_guard<std::mutex> Guard{m_PipelinesMtx};

    const auto ResType = PiplineTypeToArchiveResourceType(PSOType);
    if (ResType == ResourceType::Undefined)
    {
        UNEXPECTED("Unexpected pipeline type");
        return nullptr;
    }

    auto it = m_Pipelines.find(NamedResourceKey{ResType, PSOName});
    return it != m_Pipelines.end() ? it->second.RawPtr() : nullptr;
}